

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::
InnerMap::TransferTree(InnerMap *this,void **table,size_type index)

{
  Tree *tree;
  Node *node;
  size_type b;
  _Base_ptr p_Var1;
  iterator iStack_48;
  
  tree = (Tree *)table[index];
  p_Var1 = (tree->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    node = *(Node **)(p_Var1 + 1);
    b = BucketNumber(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)node)
    ;
    InsertUnique(&iStack_48,this,b,node);
    p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
  } while ((_Rb_tree_header *)p_Var1 != &(tree->_M_t)._M_impl.super__Rb_tree_header);
  DestroyTree(this,tree);
  return;
}

Assistant:

void TransferTree(void* const* table, size_type index) {
      Tree* tree = static_cast<Tree*>(table[index]);
      typename Tree::iterator tree_it = tree->begin();
      do {
        Node* node = NodePtrFromKeyPtr(*tree_it);
        InsertUnique(BucketNumber(**tree_it), node);
      } while (++tree_it != tree->end());
      DestroyTree(tree);
    }